

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,TimeZone *tz,UDate date,
          UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  short sVar1;
  UChar *pUVar2;
  UBool useUtcIndicator;
  UTimeZoneNameType dstType;
  UBool UVar3;
  UTimeZoneNameType stdType;
  int32_t iVar4;
  UBool isShort;
  UBool ignoreSeconds;
  UChar *srcChars;
  int32_t dstOffset;
  UErrorCode status;
  int32_t rawOffset;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  switch(style) {
  case UTZFMT_STYLE_GENERIC_LOCATION:
    iVar4 = 1;
    break;
  case UTZFMT_STYLE_GENERIC_LONG:
    iVar4 = 2;
    break;
  case UTZFMT_STYLE_GENERIC_SHORT:
    iVar4 = 4;
    break;
  case UTZFMT_STYLE_SPECIFIC_LONG:
    stdType = UTZNM_LONG_STANDARD;
    dstType = UTZNM_LONG_DAYLIGHT;
    goto LAB_0027b679;
  case UTZFMT_STYLE_SPECIFIC_SHORT:
    stdType = UTZNM_SHORT_STANDARD;
    dstType = UTZNM_SHORT_DAYLIGHT;
LAB_0027b679:
    formatSpecific(this,tz,stdType,dstType,date,name,timeType);
  default:
    goto switchD_0027b5c2_caseD_5;
  case UTZFMT_STYLE_ZONE_ID:
    icu_63::UnicodeString::operator=(name,&tz->fID);
    return name;
  case UTZFMT_STYLE_ZONE_ID_SHORT:
    pUVar2 = ZoneMeta::getShortID(tz);
    srcChars = L"unk";
    if (pUVar2 != (UChar *)0x0) {
      srcChars = pUVar2;
    }
    icu_63::UnicodeString::unBogus(name);
    sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (name->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::doReplace(name,0,iVar4,srcChars,0,-1);
    return name;
  case UTZFMT_STYLE_EXEMPLAR_LOCATION:
    formatExemplarLocation(this,tz,name);
    return name;
  }
  formatGeneric(this,tz,iVar4,date,name);
switchD_0027b5c2_caseD_5:
  if (0x1f < (ushort)(name->fUnion).fStackFields.fLengthAndFlags) {
    return name;
  }
  status = U_ZERO_ERROR;
  (*(tz->super_UObject)._vptr_UObject[6])(date,tz,0,&rawOffset,&dstOffset);
  if (U_ZERO_ERROR < status) {
    return name;
  }
  if (UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL < style) goto LAB_0027b7a1;
  switch(style) {
  default:
    UVar3 = '\0';
    break;
  case UTZFMT_STYLE_GENERIC_SHORT:
  case UTZFMT_STYLE_SPECIFIC_SHORT:
  case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
    UVar3 = '\x01';
    break;
  case UTZFMT_STYLE_ISO_BASIC_SHORT:
    useUtcIndicator = '\x01';
    goto LAB_0027b757;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    useUtcIndicator = '\0';
LAB_0027b757:
    UVar3 = '\x01';
    isShort = '\x01';
LAB_0027b78f:
    ignoreSeconds = '\x01';
LAB_0027b795:
    formatOffsetISO8601((TimeZoneFormat *)tz,dstOffset + rawOffset,UVar3,useUtcIndicator,isShort,
                        ignoreSeconds,name,&status);
    goto LAB_0027b7a1;
  case UTZFMT_STYLE_ISO_BASIC_FIXED:
    UVar3 = '\x01';
    goto LAB_0027b787;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    UVar3 = '\x01';
    goto LAB_0027b740;
  case UTZFMT_STYLE_ISO_BASIC_FULL:
    UVar3 = '\x01';
    goto LAB_0027b778;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    UVar3 = '\x01';
    goto LAB_0027b76b;
  case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    UVar3 = '\0';
LAB_0027b787:
    useUtcIndicator = '\x01';
LAB_0027b78c:
    isShort = '\0';
    goto LAB_0027b78f;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    UVar3 = '\0';
LAB_0027b740:
    useUtcIndicator = '\0';
    goto LAB_0027b78c;
  case UTZFMT_STYLE_ISO_EXTENDED_FULL:
    UVar3 = '\0';
LAB_0027b778:
    useUtcIndicator = '\x01';
LAB_0027b77d:
    isShort = '\0';
    ignoreSeconds = '\0';
    goto LAB_0027b795;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
    UVar3 = '\0';
LAB_0027b76b:
    useUtcIndicator = '\0';
    goto LAB_0027b77d;
  }
  formatOffsetLocalizedGMT(this,dstOffset + rawOffset,UVar3,name,&status);
LAB_0027b7a1:
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_DAYLIGHT - (dstOffset == 0);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(UTimeZoneFormatStyle style, const TimeZone& tz, UDate date,
        UnicodeString& name, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    UBool noOffsetFormatFallback = FALSE;

    switch (style) {
    case UTZFMT_STYLE_GENERIC_LOCATION:
        formatGeneric(tz, UTZGNM_LOCATION, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_LONG:
        formatGeneric(tz, UTZGNM_LONG, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_SHORT:
        formatGeneric(tz, UTZGNM_SHORT, date, name);
        break;
    case UTZFMT_STYLE_SPECIFIC_LONG:
        formatSpecific(tz, UTZNM_LONG_STANDARD, UTZNM_LONG_DAYLIGHT, date, name, timeType);
        break;
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        formatSpecific(tz, UTZNM_SHORT_STANDARD, UTZNM_SHORT_DAYLIGHT, date, name, timeType);
        break;

    case UTZFMT_STYLE_ZONE_ID:
        tz.getID(name);
        noOffsetFormatFallback = TRUE;
        break;
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            const UChar* shortID = ZoneMeta::getShortID(tz);
            if (shortID == NULL) {
                shortID = UNKNOWN_SHORT_ZONE_ID;
            }
            name.setTo(shortID, -1);
        }
        noOffsetFormatFallback = TRUE;
        break;

    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        formatExemplarLocation(tz, name);
        noOffsetFormatFallback = TRUE;
        break;

    default:
        // will be handled below
        break;
    }

    if (name.isEmpty() && !noOffsetFormatFallback) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t rawOffset, dstOffset;
        tz.getOffset(date, FALSE, rawOffset, dstOffset, status);
        int32_t offset = rawOffset + dstOffset;
        if (U_SUCCESS(status)) {
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
            case UTZFMT_STYLE_GENERIC_LONG:
            case UTZFMT_STYLE_SPECIFIC_LONG:
            case UTZFMT_STYLE_LOCALIZED_GMT:
                formatOffsetLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
            case UTZFMT_STYLE_SPECIFIC_SHORT:
            case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
                formatOffsetShortLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_SHORT:
                formatOffsetISO8601Basic(offset, TRUE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
                formatOffsetISO8601Basic(offset, FALSE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FIXED:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FULL:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FULL:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, FALSE, name, status);
                break;

            default:
              // UTZFMT_STYLE_ZONE_ID, UTZFMT_STYLE_ZONE_ID_SHORT, UTZFMT_STYLE_EXEMPLAR_LOCATION
              break;
            }

            if (timeType) {
                *timeType = (dstOffset != 0) ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
            }
        }
    }

    return name;
}